

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::MultiTexShader::MultiTexShader
          (MultiTexShader *this,deUint32 randSeed,int numUnits,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *unitTypes,
          vector<glu::DataType,_std::allocator<glu::DataType>_> *samplerTypes,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *texScales,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *texBiases,
          vector<int,_std::allocator<int>_> *num2dArrayLayers)

{
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *this_00;
  GenericVecType GVar1;
  uint uVar2;
  bool bVar3;
  deUint32 dVar4;
  char *__rhs;
  int unitNdx;
  long lVar5;
  int i;
  ulong uVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  int local_5ec;
  vector<glu::DataType,_std::allocator<glu::DataType>_> *local_5e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_5e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_5d8;
  vector<tcu::Vector<tcu::Vector<float,2>,3>,std::allocator<tcu::Vector<tcu::Vector<float,2>,3>>>
  *local_5d0;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *local_5c8;
  int local_5bc;
  string samplerName;
  string samplersStr;
  GenericVecType GStack_548;
  int local_514;
  string samplerName_1;
  string ndxStr;
  string lookupCoord;
  string transformationName;
  string biasName_1;
  string scaleName_1;
  string transformationName_1;
  string scaleName;
  string biasName;
  Matrix<float,_3,_3> local_340;
  Matrix<float,_3,_3> local_318;
  Matrix<float,_3,_3> local_2f0;
  Matrix<float,_3,_3> local_2c8;
  string colorMultiplier;
  Random rnd;
  Matrix<float,_3,_3> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  FragmentSource local_1f8;
  Matrix<float,_3,_3> local_1d8;
  Matrix<float,_3,_3> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  Mat4 transformation;
  
  local_5e0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              CONCAT44(local_5e0._4_4_,numUnits);
  local_5e8 = samplerTypes;
  local_5d8 = unitTypes;
  local_5c8 = texScales;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)&transformation);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&samplerName,"a_position",(allocator<char> *)&transformationName);
  std::__cxx11::string::string((string *)&samplersStr,(string *)&samplerName);
  stack0xfffffffffffffab4 = (ulong)(uint)samplersStr.field_2._12_4_;
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)&transformation,(VertexAttribute *)&samplersStr);
  std::__cxx11::string::~string((string *)&samplersStr);
  std::__cxx11::string::~string((string *)&samplerName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&samplerName,"a_coord",(allocator<char> *)&transformationName);
  std::__cxx11::string::string((string *)&samplersStr,(string *)&samplerName);
  stack0xfffffffffffffab4 = stack0xfffffffffffffab4 & 0xffffffff;
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)&transformation,(VertexAttribute *)&samplersStr);
  std::__cxx11::string::~string((string *)&samplersStr);
  std::__cxx11::string::~string((string *)&samplerName);
  samplersStr._M_dataplus._M_p = (pointer)((ulong)samplersStr._M_dataplus._M_p._5_3_ << 0x28);
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)&transformation,(VertexToFragmentVarying *)&samplersStr);
  samplersStr._M_dataplus._M_p = samplersStr._M_dataplus._M_p & 0xffffffff00000000;
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)&transformation,(FragmentOutput *)&samplersStr);
  for (colorMultiplier._M_dataplus._M_p._0_4_ = 0;
      (int)colorMultiplier._M_dataplus._M_p < (int)local_5e0;
      colorMultiplier._M_dataplus._M_p._0_4_ = (int)colorMultiplier._M_dataplus._M_p + 1) {
    de::toString<int>(&samplersStr,(int *)&colorMultiplier);
    std::operator+(&samplerName,"u_sampler",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&samplersStr
                  );
    std::__cxx11::string::~string((string *)&samplersStr);
    de::toString<int>(&samplersStr,(int *)&colorMultiplier);
    std::operator+(&transformationName,"u_trans",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&samplersStr
                  );
    std::__cxx11::string::~string((string *)&samplersStr);
    de::toString<int>(&samplersStr,(int *)&colorMultiplier);
    std::operator+(&scaleName,"u_texScale",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&samplersStr
                  );
    std::__cxx11::string::~string((string *)&samplersStr);
    de::toString<int>(&samplersStr,(int *)&colorMultiplier);
    std::operator+(&biasName,"u_texBias",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&samplersStr
                  );
    std::__cxx11::string::~string((string *)&samplersStr);
    GVar1 = (local_5e8->super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>)._M_impl.
            super__Vector_impl_data._M_start[(int)colorMultiplier._M_dataplus._M_p];
    std::__cxx11::string::string((string *)&samplersStr,(string *)&samplerName);
    GStack_548 = GVar1;
    sglr::pdec::ShaderProgramDeclaration::operator<<
              ((ShaderProgramDeclaration *)&transformation,(Uniform *)&samplersStr);
    std::__cxx11::string::~string((string *)&samplersStr);
    std::__cxx11::string::string((string *)&samplersStr,(string *)&transformationName);
    GStack_548 = 0xd;
    sglr::pdec::ShaderProgramDeclaration::operator<<
              ((ShaderProgramDeclaration *)&transformation,(Uniform *)&samplersStr);
    std::__cxx11::string::~string((string *)&samplersStr);
    std::__cxx11::string::string((string *)&samplersStr,(string *)&scaleName);
    GStack_548 = 4;
    sglr::pdec::ShaderProgramDeclaration::operator<<
              ((ShaderProgramDeclaration *)&transformation,(Uniform *)&samplersStr);
    std::__cxx11::string::~string((string *)&samplersStr);
    std::__cxx11::string::string((string *)&samplersStr,(string *)&biasName);
    stack0xfffffffffffffab4 = CONCAT44(4,samplersStr.field_2._12_4_);
    sglr::pdec::ShaderProgramDeclaration::operator<<
              ((ShaderProgramDeclaration *)&transformation,(Uniform *)&samplersStr);
    std::__cxx11::string::~string((string *)&samplersStr);
    std::__cxx11::string::~string((string *)&biasName);
    std::__cxx11::string::~string((string *)&scaleName);
    std::__cxx11::string::~string((string *)&transformationName);
    std::__cxx11::string::~string((string *)&samplerName);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&samplerName,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\n\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,(allocator<char> *)&transformationName);
  std::__cxx11::string::string((string *)&samplersStr,(string *)&samplerName);
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)&transformation,(VertexSource *)&samplersStr);
  std::__cxx11::string::~string((string *)&samplersStr);
  std::__cxx11::string::~string((string *)&samplerName);
  samplersStr._M_dataplus._M_p = (pointer)&samplersStr.field_2;
  samplersStr._M_string_length = 0;
  samplersStr.field_2._M_allocated_capacity._0_4_ =
       samplersStr.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  samplerName._M_dataplus._M_p = (pointer)&samplerName.field_2;
  samplerName._M_string_length._0_4_ = 0;
  samplerName._M_string_length._4_4_ = 0;
  transformationName._M_dataplus._M_p = (pointer)&transformationName.field_2;
  transformationName._M_string_length = 0;
  samplerName.field_2._M_allocated_capacity._0_4_ =
       samplerName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  transformationName.field_2._M_allocated_capacity =
       transformationName.field_2._M_allocated_capacity & 0xffffffffffffff00;
  scaleName._M_dataplus._M_p = (pointer)&scaleName.field_2;
  scaleName._M_string_length = 0;
  local_514 = (int)local_5e0;
  scaleName.field_2._M_allocated_capacity =
       scaleName.field_2._M_allocated_capacity & 0xffffffffffffff00;
  biasName._M_dataplus._M_p = (pointer)&biasName.field_2;
  biasName._M_string_length._0_4_ = 0.0;
  biasName._M_string_length._4_4_ = 0;
  biasName.field_2._M_allocated_capacity._0_4_ =
       biasName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  de::toString<int>(&samplerName_1,&local_514);
  std::operator+(&ndxStr,"(1.0/",&samplerName_1);
  std::operator+(&colorMultiplier,&ndxStr,".0)");
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::~string((string *)&samplerName_1);
  for (local_5ec = 0; local_5ec < local_514; local_5ec = local_5ec + 1) {
    de::toString<int>(&ndxStr,&local_5ec);
    std::operator+(&samplerName_1,"u_sampler",&ndxStr);
    std::operator+(&transformationName_1,"u_trans",&ndxStr);
    std::operator+(&scaleName_1,"u_texScale",&ndxStr);
    std::operator+(&biasName_1,"u_texBias",&ndxStr);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_318,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_340,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_318,
                   "uniform highp ");
    __rhs = glu::getDataTypeName
                      ((local_5e8->super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>
                       )._M_impl.super__Vector_impl_data._M_start[local_5ec]);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_340,
                   __rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                   " ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c8,
                   &samplerName_1);
    std::operator+(&lookupCoord,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f0,
                   ";\n");
    std::__cxx11::string::append((string *)&samplersStr);
    std::__cxx11::string::~string((string *)&lookupCoord);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_318);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f0,
                   "uniform highp mat4 ",&transformationName_1);
    std::operator+(&lookupCoord,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f0,
                   ";\n");
    std::__cxx11::string::append((string *)&samplerName);
    std::__cxx11::string::~string((string *)&lookupCoord);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f0,
                   "uniform highp vec4 ",&scaleName_1);
    std::operator+(&lookupCoord,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f0,
                   ";\n");
    std::__cxx11::string::append((string *)&transformationName);
    std::__cxx11::string::~string((string *)&lookupCoord);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f0,
                   "uniform highp vec4 ",&biasName_1);
    std::operator+(&lookupCoord,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f0,
                   ";\n");
    std::__cxx11::string::append((string *)&scaleName);
    std::__cxx11::string::~string((string *)&lookupCoord);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::operator+(&lookupCoord,&transformationName_1,"*vec4(v_coord, 1.0, 1.0)");
    if ((local_5d8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start[local_5ec] == 0xde1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c8
                     ,"vec2(",&lookupCoord);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f0
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_2c8,")");
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c8
                     ,"vec3(",&lookupCoord);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f0
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_2c8,")");
    }
    std::__cxx11::string::operator=((string *)&lookupCoord,(string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::operator+(&local_188,"\tcolor += ",&colorMultiplier);
    std::operator+(&local_168,&local_188,"*(vec4(texture(");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                   &local_168,&samplerName_1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,", ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_240,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8,
                   &lookupCoord);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_318,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_240,
                   "))*");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_340,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_318,
                   &scaleName_1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_340,
                   " + ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                   &biasName_1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c8,
                   ");\n");
    std::__cxx11::string::append((string *)&biasName);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&rnd);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&lookupCoord);
    std::__cxx11::string::~string((string *)&biasName_1);
    std::__cxx11::string::~string((string *)&scaleName_1);
    std::__cxx11::string::~string((string *)&transformationName_1);
    std::__cxx11::string::~string((string *)&samplerName_1);
    std::__cxx11::string::~string((string *)&ndxStr);
  }
  std::operator+(&lookupCoord,"#version 300 es\nlayout(location = 0) out mediump vec4 o_color;\n",
                 &samplersStr);
  std::operator+(&biasName_1,&lookupCoord,&samplerName);
  std::operator+(&scaleName_1,&biasName_1,&transformationName);
  std::operator+(&transformationName_1,&scaleName_1,&scaleName);
  std::operator+(&samplerName_1,&transformationName_1,
                 "in highp vec2 v_coord;\n\nvoid main (void)\n{\n\tmediump vec4 color = vec4(0.0);\n"
                );
  std::operator+(&ndxStr,&samplerName_1,&biasName);
  std::operator+(&local_218,&ndxStr,"\to_color = color;\n}\n");
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::~string((string *)&samplerName_1);
  std::__cxx11::string::~string((string *)&transformationName_1);
  std::__cxx11::string::~string((string *)&scaleName_1);
  std::__cxx11::string::~string((string *)&biasName_1);
  std::__cxx11::string::~string((string *)&lookupCoord);
  std::__cxx11::string::~string((string *)&colorMultiplier);
  std::__cxx11::string::~string((string *)&biasName);
  std::__cxx11::string::~string((string *)&scaleName);
  std::__cxx11::string::~string((string *)&transformationName);
  std::__cxx11::string::~string((string *)&samplerName);
  std::__cxx11::string::~string((string *)&samplersStr);
  std::__cxx11::string::string((string *)&local_1f8,(string *)&local_218);
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)&transformation,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  sglr::ShaderProgram::ShaderProgram
            (&this->super_ShaderProgram,(ShaderProgramDeclaration *)&transformation);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)&transformation);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_01e33278;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_01e332b0;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_01e332c8;
  *(int *)&(this->super_ShaderProgram).field_0x154 = (int)local_5e0;
  local_5e0 = &this->m_unitTypes;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(local_5e0,local_5d8);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&this->m_texScales,local_5c8);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&this->m_texBiases,texBiases);
  this_00 = &this->m_transformations;
  local_5d0 = (vector<tcu::Vector<tcu::Vector<float,2>,3>,std::allocator<tcu::Vector<tcu::Vector<float,2>,3>>>
               *)&this->m_lodDerivateParts;
  (this->m_lodDerivateParts).
  super__Vector_base<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_lodDerivateParts).
  super__Vector_base<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_transformations).
  super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_lodDerivateParts).
  super__Vector_base<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_transformations).
  super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_transformations).
  super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  deRandom_init(&rnd.m_rnd,randSeed);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::reserve
            (this_00,(long)*(int *)&(this->super_ShaderProgram).field_0x154);
  std::
  vector<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
  ::reserve((vector<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
             *)local_5d0,(long)*(int *)&(this->super_ShaderProgram).field_0x154);
  local_5bc = 0;
  for (lVar5 = 0; lVar5 < *(int *)&(this->super_ShaderProgram).field_0x154; lVar5 = lVar5 + 1) {
    uVar2 = (local_5e0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar5];
    if (uVar2 == 0x8513) {
      for (uVar6 = 0; uVar6 != 9; uVar6 = uVar6 + 1) {
        if ((uVar6 & 0xb) == 0) {
          fVar8 = deRandom_getFloat(&rnd.m_rnd);
          *(float *)((long)&samplerName._M_dataplus._M_p + uVar6 * 4) = fVar8 * 0.79999995 + 0.1;
        }
        else if (uVar6 != 8) {
          *(undefined4 *)((long)&samplerName._M_dataplus._M_p + uVar6 * 4) = 0;
        }
      }
      dVar4 = deRandom_getUint32(&rnd.m_rnd);
      tcu::Matrix<float,_3,_3>::Matrix
                ((Matrix<float,_3,_3> *)&transformationName,(float *)&samplerName);
      tcu::Matrix<float,_3,_3>::Matrix
                ((Matrix<float,_3,_3> *)&scaleName,
                 MultiTexShader::s_cubeTransforms[(ulong)dVar4 % 6]);
      tcu::operator*((Matrix<float,_3,_3> *)&samplersStr,(Matrix<float,_3,_3> *)&scaleName,
                     (Matrix<float,_3,_3> *)&transformationName);
      matExtend3To4(&transformation,(Mat3 *)&samplersStr);
      matExtend3To4((Mat4 *)&samplersStr,(Mat3 *)&transformationName);
      calculateLodDerivateParts((Vector<tcu::Vector<float,_2>,_3> *)&scaleName,(Mat4 *)&samplersStr)
      ;
      std::
      vector<tcu::Vector<tcu::Vector<float,2>,3>,std::allocator<tcu::Vector<tcu::Vector<float,2>,3>>>
      ::emplace_back<tcu::Vector<tcu::Vector<float,2>,3>>
                (local_5d0,(Vector<tcu::Vector<float,_2>,_3> *)&scaleName);
      std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
                (this_00,&transformation);
    }
    else if (uVar2 == 0xde1) {
      fVar8 = deRandom_getFloat(&rnd.m_rnd);
      local_5e8._0_4_ = fVar8 * 6.2831855;
      fVar8 = deRandom_getFloat(&rnd.m_rnd);
      fVar9 = deRandom_getFloat(&rnd.m_rnd);
      fVar10 = deRandom_getFloat(&rnd.m_rnd);
      local_5d8._0_4_ = fVar10 * 0.5;
      fVar10 = deRandom_getFloat(&rnd.m_rnd);
      local_5c8._0_4_ = fVar10 * 0.5;
      fVar10 = deRandom_getFloat(&rnd.m_rnd);
      fVar11 = deRandom_getFloat(&rnd.m_rnd);
      local_5e8._0_4_ = local_5e8._0_4_ + 0.0;
      local_5d8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  CONCAT44(local_5d8._4_4_,local_5d8._0_4_ + 0.0);
      local_5c8 = (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                  CONCAT44(local_5c8._4_4_,local_5c8._0_4_ + 0.0);
      fVar12 = cosf(local_5e8._0_4_);
      samplersStr._M_dataplus._M_p._0_4_ = fVar12;
      fVar12 = sinf(local_5e8._0_4_);
      samplersStr._M_dataplus._M_p =
           (pointer)(CONCAT44(fVar12,samplersStr._M_dataplus._M_p._0_4_) ^ 0x8000000000000000);
      samplersStr._M_string_length = samplersStr._M_string_length & 0xffffffff00000000;
      fVar12 = sinf(local_5e8._0_4_);
      samplersStr._M_string_length = CONCAT44(fVar12,(undefined4)samplersStr._M_string_length);
      samplersStr.field_2._M_allocated_capacity._0_4_ = cosf(local_5e8._0_4_);
      samplerName._M_dataplus._M_p._4_4_ = 0;
      samplerName._M_string_length._0_4_ = 0;
      samplersStr.field_2._4_8_ = 0;
      stack0xfffffffffffffab4 = 0x3f80000000000000;
      samplerName._M_string_length._4_4_ = 0;
      samplerName.field_2._M_allocated_capacity._4_4_ = 0;
      samplerName.field_2._8_4_ = 0;
      samplerName.field_2._12_4_ = 0;
      transformationName._M_dataplus._M_p._4_4_ = local_5d8._0_4_;
      transformationName._M_dataplus._M_p._0_4_ = 0x3f800000;
      transformationName._M_string_length = 0;
      transformationName.field_2._M_allocated_capacity = 0x3f800000;
      transformationName.field_2._8_8_ = 0;
      scaleName._M_dataplus._M_p = (pointer)0x3f800000;
      scaleName._M_string_length = (long)local_5c8 << 0x20;
      scaleName.field_2._M_allocated_capacity = 0x3f800000;
      scaleName.field_2._8_8_ = 0;
      biasName._M_dataplus._M_p = (pointer)0x3f800000;
      biasName._M_string_length._4_4_ = 0;
      biasName.field_2._M_allocated_capacity._0_4_ = 0x3f800000;
      biasName.field_2._8_8_ = 0;
      samplerName._M_dataplus._M_p._0_4_ = fVar8 * 0.8 + 0.7;
      samplerName.field_2._M_allocated_capacity._0_4_ = fVar9 * 0.8 + 0.7;
      biasName._M_string_length._0_4_ = fVar10 + -0.5;
      biasName.field_2._M_allocated_capacity._4_4_ = fVar11 + -0.5;
      tcu::Matrix<float,_3,_3>::Matrix
                ((Matrix<float,_3,_3> *)&lookupCoord,MultiTexShader::tempOffsetData);
      tcu::Matrix<float,_3,_3>::Matrix(&local_2f0,(float *)&biasName);
      tcu::operator*((Matrix<float,_3,_3> *)&biasName_1,(Matrix<float,_3,_3> *)&lookupCoord,
                     &local_2f0);
      tcu::Matrix<float,_3,_3>::Matrix(&local_2c8,(float *)&samplersStr);
      tcu::operator*((Matrix<float,_3,_3> *)&scaleName_1,(Matrix<float,_3,_3> *)&biasName_1,
                     &local_2c8);
      tcu::Matrix<float,_3,_3>::Matrix(&local_1b0,(float *)&samplerName);
      tcu::operator*((Matrix<float,_3,_3> *)&transformationName_1,
                     (Matrix<float,_3,_3> *)&scaleName_1,&local_1b0);
      tcu::Matrix<float,_3,_3>::Matrix(&local_340,(float *)&transformationName);
      tcu::operator*((Matrix<float,_3,_3> *)&samplerName_1,
                     (Matrix<float,_3,_3> *)&transformationName_1,&local_340);
      tcu::Matrix<float,_3,_3>::Matrix(&local_318,(float *)&scaleName);
      tcu::operator*((Matrix<float,_3,_3> *)&ndxStr,(Matrix<float,_3,_3> *)&samplerName_1,&local_318
                    );
      tcu::Matrix<float,_3,_3>::Matrix(&local_1d8,MultiTexShader::tempOffsetData);
      tcu::operator*(&local_240,&local_1d8,-1.0);
      tcu::operator*((Matrix<float,_3,_3> *)&colorMultiplier,(Matrix<float,_3,_3> *)&ndxStr,
                     &local_240);
      matExtend3To4(&transformation,(Mat3 *)&colorMultiplier);
      calculateLodDerivateParts
                ((Vector<tcu::Vector<float,_2>,_3> *)&colorMultiplier,&transformation);
      std::
      vector<tcu::Vector<tcu::Vector<float,2>,3>,std::allocator<tcu::Vector<tcu::Vector<float,2>,3>>>
      ::emplace_back<tcu::Vector<tcu::Vector<float,2>,3>>
                (local_5d0,(Vector<tcu::Vector<float,_2>,_3> *)&colorMultiplier);
      std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
                (this_00,&transformation);
    }
    else {
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
        bVar3 = de::Random::getBool((Random *)&rnd.m_rnd);
        fVar8 = deRandom_getFloat(&rnd.m_rnd);
        fVar8 = fVar8 * 0.7 + 0.7;
        if (!bVar3) {
          fVar8 = -fVar8;
        }
        transformation.m_data.m_data[0].m_data[lVar7] = fVar8;
      }
      tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)&samplersStr,(float *)&transformation)
      ;
      if ((local_5e0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar5] == 0x8c1a) {
        samplerName._M_dataplus._M_p._4_4_ = 0;
        samplerName._M_string_length._0_4_ = 0;
        samplerName._M_string_length._4_4_ = 0;
        samplerName.field_2._M_allocated_capacity._0_4_ = 0;
        samplerName.field_2._8_4_ = 0;
        samplerName.field_2._12_4_ = 0;
        samplerName._M_dataplus._M_p._0_4_ = 1.0;
        samplerName.field_2._M_allocated_capacity._4_4_ = 0x3f800000;
        tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)&biasName,(float *)&samplerName);
        tcu::operator*((Matrix<float,_4,_4> *)&scaleName,(Matrix<float,_4,_4> *)&samplersStr,
                       (Matrix<float,_4,_4> *)&biasName);
        tcu::Matrix<float,_4,_4>::Matrix
                  ((Matrix<float,_4,_4> *)&colorMultiplier,MultiTexShader::zTranslationTransfData);
        tcu::operator*((Matrix<float,_4,_4> *)&transformationName,(Matrix<float,_4,_4> *)&scaleName,
                       (Matrix<float,_4,_4> *)&colorMultiplier);
        tcu::Matrix<float,_4,_4>::operator=
                  ((Matrix<float,_4,_4> *)&samplersStr,(Matrix<float,_4,_4> *)&transformationName);
        local_5bc = local_5bc + 1;
      }
      calculateLodDerivateParts
                ((Vector<tcu::Vector<float,_2>,_3> *)&samplerName,(Mat4 *)&samplersStr);
      std::
      vector<tcu::Vector<tcu::Vector<float,2>,3>,std::allocator<tcu::Vector<tcu::Vector<float,2>,3>>>
      ::emplace_back<tcu::Vector<tcu::Vector<float,2>,3>>
                (local_5d0,(Vector<tcu::Vector<float,_2>,_3> *)&samplerName);
      tcu::Matrix<float,_4,_4>::Matrix
                ((Matrix<float,_4,_4> *)&samplerName,(Matrix<float,_4,_4> *)&samplersStr);
      std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
      emplace_back<tcu::Matrix<float,4,4>>
                ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
                 (Matrix<float,_4,_4> *)&samplerName);
    }
  }
  return;
}

Assistant:

MultiTexShader::MultiTexShader (deUint32 randSeed,
								int numUnits,
								const vector<GLenum>& unitTypes,
								const vector<glu::DataType>& samplerTypes,
								const vector<Vec4>& texScales,
								const vector<Vec4>& texBiases,
								const vector<int>& num2dArrayLayers)
		: sglr::ShaderProgram	(generateShaderProgramDeclaration(numUnits, unitTypes, samplerTypes))
		, m_numUnits		(numUnits)
		, m_unitTypes		(unitTypes)
		, m_texScales		(texScales)
		, m_texBiases		(texBiases)
{
	// 2d-to-cube-face transformations.
	// \note 2d coordinates range from 0 to 1 and cube face coordinates from -1 to 1, so scaling is done as well.
	static const float s_cubeTransforms[][3*3] =
	{
		// Face -X: (x, y, 1) -> (-1, -(2*y-1), +(2*x-1))
		{  0.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f,
		   2.0f,  0.0f, -1.0f },
		// Face +X: (x, y, 1) -> (+1, -(2*y-1), -(2*x-1))
		{  0.0f,  0.0f,  1.0f,
		   0.0f, -2.0f,  1.0f,
		  -2.0f,  0.0f,  1.0f },
		// Face -Y: (x, y, 1) -> (+(2*x-1), -1, -(2*y-1))
		{  2.0f,  0.0f, -1.0f,
		   0.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f },
		// Face +Y: (x, y, 1) -> (+(2*x-1), +1, +(2*y-1))
		{  2.0f,  0.0f, -1.0f,
		   0.0f,  0.0f,  1.0f,
		   0.0f,  2.0f, -1.0f },
		// Face -Z: (x, y, 1) -> (-(2*x-1), -(2*y-1), -1)
		{ -2.0f,  0.0f,  1.0f,
		   0.0f, -2.0f,  1.0f,
		   0.0f,  0.0f, -1.0f },
		// Face +Z: (x, y, 1) -> (+(2*x-1), -(2*y-1), +1)
		{  2.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f,
		   0.0f,  0.0f,  1.0f }
	};

	// Generate transformation matrices.

	de::Random rnd(randSeed);

	m_transformations.reserve(m_numUnits);
	m_lodDerivateParts.reserve(m_numUnits);

	int tex2dArrayNdx = 0; // Keep track of 2d texture array index.

	DE_ASSERT((int)m_unitTypes.size() == m_numUnits);

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		if (m_unitTypes[unitNdx] == GL_TEXTURE_2D)
		{
			float rotAngle				= rnd.getFloat(0.0f, 2.0f*DE_PI);
			float xScaleFactor			= rnd.getFloat(0.7f, 1.5f);
			float yScaleFactor			= rnd.getFloat(0.7f, 1.5f);
			float xShearAmount			= rnd.getFloat(0.0f, 0.5f);
			float yShearAmount			= rnd.getFloat(0.0f, 0.5f);
			float xTranslationAmount	= rnd.getFloat(-0.5f, 0.5f);
			float yTranslationAmount	= rnd.getFloat(-0.5f, 0.5f);

			static const float tempOffsetData[3*3] = // For temporarily centering the coordinates to get nicer transformations.
			{
				1.0f,  0.0f, -0.5f,
				0.0f,  1.0f, -0.5f,
				0.0f,  0.0f,  1.0f
			};
			float rotTransfData[3*3] =
			{
				deFloatCos(rotAngle),	-deFloatSin(rotAngle),	0.0f,
				deFloatSin(rotAngle),	deFloatCos(rotAngle),	0.0f,
				0.0f,					0.0f,					1.0f
			};
			float scaleTransfData[3*3] =
			{
				xScaleFactor,	0.0f,			0.0f,
				0.0f,			yScaleFactor,	0.0f,
				0.0f,			0.0f,			1.0f
			};
			float xShearTransfData[3*3] =
			{
				1.0f,			xShearAmount,	0.0f,
				0.0f,			1.0f,			0.0f,
				0.0f,			0.0f,			1.0f
			};
			float yShearTransfData[3*3] =
			{
				1.0f,			0.0f,			0.0f,
				yShearAmount,	1.0f,			0.0f,
				0.0f,			0.0f,			1.0f
			};
			float translationTransfData[3*3] =
			{
				1.0f,	0.0f,	xTranslationAmount,
				0.0f,	1.0f,	yTranslationAmount,
				0.0f,	0.0f,	1.0f
			};

			Mat4 transformation = matExtend3To4(Mat3(tempOffsetData) *
												Mat3(translationTransfData) *
												Mat3(rotTransfData) *
												Mat3(scaleTransfData) *
												Mat3(xShearTransfData) *
												Mat3(yShearTransfData) *
												(Mat3(tempOffsetData) * (-1.0f)));

			m_lodDerivateParts.push_back(calculateLodDerivateParts(transformation));
			m_transformations.push_back(transformation);
		}
		else if (m_unitTypes[unitNdx] == GL_TEXTURE_CUBE_MAP)
		{
			DE_STATIC_ASSERT((int)tcu::CUBEFACE_LAST == DE_LENGTH_OF_ARRAY(s_cubeTransforms));

			float planarTransData[3*3];

			// In case of a cube map, we only want to render one face, so the transformation needs to be restricted - only enlarging scaling is done.

			for (int i = 0; i < DE_LENGTH_OF_ARRAY(planarTransData); i++)
			{
				if (i == 0 || i == 4)
					planarTransData[i] = rnd.getFloat(0.1f, 0.9f); // Two first diagonal cells control the scaling.
				else if (i == 8)
					planarTransData[i] = 1.0f;
				else
					planarTransData[i] = 0.0f;
			}

			int		faceNdx			= rnd.getInt(0, (int)tcu::CUBEFACE_LAST - 1);
			Mat3	planarTrans		(planarTransData);												// Planar, face-agnostic transformation.
			Mat4	finalTrans		= matExtend3To4(Mat3(s_cubeTransforms[faceNdx]) * planarTrans);	// Final transformation from planar to cube map coordinates, including the transformation just generated.
			Mat4	planarTrans4x4	= matExtend3To4(planarTrans);

			m_lodDerivateParts.push_back(calculateLodDerivateParts(planarTrans4x4));
			m_transformations.push_back(finalTrans);
		}
		else
		{
			DE_ASSERT(m_unitTypes[unitNdx] == GL_TEXTURE_3D || m_unitTypes[unitNdx] == GL_TEXTURE_2D_ARRAY);

			float transData[4*4];

			for (int i = 0; i < 4*4; i++)
			{
				float sign = rnd.getBool() ? 1.0f : -1.0f;
				transData[i] = rnd.getFloat(0.7f, 1.4f) * sign;
			}

			Mat4 transformation(transData);

			if (m_unitTypes[unitNdx] == GL_TEXTURE_2D_ARRAY)
			{
				// Z direction: Translate by 0.5 and scale by layer amount.

				float numLayers = (float)num2dArrayLayers[tex2dArrayNdx];

				static const float zTranslationTransfData[4*4] =
				{
					1.0f, 0.0f, 0.0f, 0.0f,
					0.0f, 1.0f, 0.0f, 0.0f,
					0.0f, 0.0f, 1.0f, 0.5f,
					0.0f, 0.0f, 0.0f, 1.0f
				};

				float zScaleTransfData[4*4] =
				{
					1.0f,		0.0f,		0.0f,		0.0f,
					0.0f,		1.0f,		0.0f,		0.0f,
					0.0f,		0.0f,		numLayers,	0.0f,
					0.0f,		0.0f,		0.0f,		1.0f
				};

				transformation = transformation * Mat4(zScaleTransfData) * Mat4(zTranslationTransfData);

				tex2dArrayNdx++;
			}

			m_lodDerivateParts.push_back(calculateLodDerivateParts(transformation));
			m_transformations.push_back(Mat4(transformation));
		}
	}
}